

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O2

bool ZiSaveDatabase(hs_database_t *db,ZiEncryptHdr *header,char *file)

{
  uint uVar1;
  size_t db_len;
  char *serialized_db;
  ofstream out;
  
  printf("[ Info ] Serializing database to file: \'%s\'\n",file);
  uVar1 = hs_serialize_database(db);
  if (uVar1 == 0) {
    printf("[ Info ] Serialized Size: \'%zu\'\n",0);
    std::ofstream::ofstream(&out,file,_S_out|_S_bin);
    if (header == (ZiEncryptHdr *)0x0) {
      puts("[ Info ] Serialize: DB will not be encrypted");
    }
    else {
      puts("[ Info ] Serialize: Writing header...");
      std::ostream::write((char *)&out,(long)header);
    }
    std::ostream::write((char *)&out,0);
    std::ofstream::close();
    free((void *)0x0);
    std::ofstream::~ofstream(&out);
  }
  else {
    fprintf(_stderr,"[ ERROR ] Serialize Failed with: \'%d\'\n",(ulong)uVar1);
  }
  return uVar1 == 0;
}

Assistant:

bool ZiSaveDatabase(const hs_database_t* db, struct ZiEncryptHdr* header,
    const char* file)
{
    printf("[ Info ] Serializing database to file: '%s'\n", file);

    char* serialized_db = nullptr;
    size_t db_len = 0;
    hs_error_t err = hs_serialize_database(db, &serialized_db, &db_len);
    if (err != HS_SUCCESS)
    {
        fprintf(stderr, "[ ERROR ] Serialize Failed with: '%d'\n", err);
        return false;
    }
    printf("[ Info ] Serialized Size: '%zu'\n", db_len);

    ofstream out(file, ios::binary | ios::out);
    if (header)
    {
        printf("[ Info ] Serialize: Writing header...\n");
        out.write((char*) header, sizeof(struct ZiEncryptHdr));
    }
    else
    {
        printf("[ Info ] Serialize: DB will not be encrypted\n");
    }

    out.write(serialized_db, db_len);
    out.close();

    free(serialized_db);
    return true;
}